

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O0

unsigned_long __thiscall
libdivide::divider<unsigned_long,_(libdivide::Branching)0>::recover
          (divider<unsigned_long,_(libdivide::Branching)0> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *in_RDI;
  uint64_t full_q;
  int dr_exceeds_d;
  uint64_t dr_hi;
  uint64_t dr_lo;
  uint64_t half_q;
  uint64_t r_lo;
  uint64_t r_hi;
  uint64_t d_lo;
  uint64_t d_hi;
  uint64_t half_n_lo;
  uint64_t half_n_hi;
  uint64_t rem_ignored;
  uint64_t hi_dividend;
  uint8_t shift;
  uint8_t more;
  uint64_t result;
  __uint128_t remainder;
  uint64_t res;
  __uint128_t vfull;
  __uint128_t ufull;
  bool local_13a;
  ulong local_f8;
  long local_f0;
  ulong local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  long local_d0;
  byte local_b2;
  byte local_b1;
  unsigned_long local_a8;
  long local_70;
  ulong local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong *local_30;
  long *local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_b1 = (byte)in_RDI[1];
  local_b2 = local_b1 & 0x3f;
  if (*in_RDI == 0) {
    local_a8 = 1L << local_b2;
  }
  else if ((local_b1 & 0x40) == 0) {
    local_a8 = 1;
  }
  else {
    local_d0 = 1L << local_b2;
    local_d8 = 0;
    local_e0 = 1;
    local_e8 = *in_RDI;
    local_10 = 0;
    local_18 = 1;
    local_28 = &local_f0;
    local_30 = &local_f8;
    local_48 = 0;
    local_50 = 1;
    local_58 = local_e8;
    local_40 = local_d0;
    local_20 = local_e8;
    local_8 = local_d0;
    local_60 = __udivti3(0,local_d0,local_e8,1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_60;
    uVar3 = SUB168(auVar1 * auVar2,0);
    local_70 = (local_40 - (SUB168(auVar1 * auVar2,8) + local_50 * local_60)) -
               (ulong)(local_48 < uVar3);
    *local_30 = local_48 - uVar3;
    *local_28 = local_70;
    uVar3 = local_f0 * 2 + (ulong)(local_f8 * 2 < local_f8);
    local_13a = true;
    if (uVar3 < 2) {
      local_13a = uVar3 == 1 && local_e8 <= local_f8 * 2;
    }
    local_a8 = local_60 * 2 + (long)(int)(uint)local_13a + 1;
  }
  return local_a8;
}

Assistant:

T recover() const { return div.recover(); }